

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdReplace<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,unsigned_long>
          (Thread *this,Instr instr)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  undefined1 local_28 [8];
  Simd<unsigned_long,_(unsigned_char)__x02_> simd;
  unsigned_long val;
  Thread *this_local;
  
  simd.v[1] = Pop<unsigned_long>(this);
  _local_28 = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  uVar1 = simd.v[1];
  puVar2 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                     ((Simd<unsigned_long,_(unsigned_char)__x02_> *)local_28,instr.field_2.imm_u8);
  *puVar2 = uVar1;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,_local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}